

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_c_binding.cpp
# Opt level: O1

int __thiscall basis_file::open(basis_file *this,char *__file,int __oflag,...)

{
  char cVar1;
  undefined8 uVar2;
  
  this->m_file = (uint8_t *)__file;
  this->byteLength = __oflag;
  cVar1 = basist::basisu_transcoder::validate_header(&this->m_transcoder,(uint)__file);
  if (cVar1 == '\0') {
    this->m_file = (uint8_t *)0x0;
    this->byteLength = 0;
  }
  else {
    uVar2 = basist::basisu_transcoder::get_file_info
                      (&this->m_transcoder,(uint)this->m_file,
                       (basisu_file_info *)(ulong)this->byteLength);
    if ((char)uVar2 != '\0') {
      this->m_magic = 0xdeadbee1;
      return (int)CONCAT71((int7)((ulong)uVar2 >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool basis_file::open(const uint8_t *buffer, uint32_t newByteLength) {
    m_file = buffer;
    byteLength = newByteLength;

    if (!m_transcoder.validate_header(buffer, newByteLength)) {
        m_file = nullptr;
        byteLength = 0;
        return false;
    }

    if (!m_transcoder.get_file_info(m_file, byteLength, fileinfo))
    {
        return false;
    }

    // Initialized after validation
    m_magic = MAGIC;
    return true;
}